

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::convert_row_major_matrix
          (CompilerMSL *this,string *exp_str,SPIRType *exp_type,uint32_t physical_type_id,
          bool is_packed)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000081;
  byte in_R9B;
  string local_a0 [32];
  string local_80 [48];
  undefined1 local_50 [43];
  bool is_packed_local;
  uint32_t physical_type_id_local;
  SPIRType *exp_type_local;
  string *exp_str_local;
  CompilerMSL *this_local;
  
  register0x00000008 = (SPIRType *)CONCAT44(in_register_0000000c,physical_type_id);
  local_50._36_4_ = (undefined4)CONCAT71(in_register_00000081,is_packed);
  local_50[0x23] = in_R9B & 1;
  exp_type_local = exp_type;
  exp_str_local = exp_str;
  this_local = this;
  bVar1 = Compiler::is_matrix((Compiler *)exp_str,register0x00000008);
  if (bVar1) {
    CompilerGLSL::strip_enclosed_expression((CompilerGLSL *)exp_str,(string *)exp_type);
    if ((local_50._36_4_ != 0) || ((local_50[0x23] & 1) != 0)) {
      ::std::__cxx11::string::string(local_a0,(string *)exp_type);
      (**(code **)(*(long *)exp_str + 0x108))
                (local_80,exp_str,local_a0,stack0xffffffffffffffd8,local_50._36_4_,
                 local_50[0x23] & 1,1);
      ::std::__cxx11::string::operator=((string *)exp_type,local_80);
      ::std::__cxx11::string::~string(local_80);
      ::std::__cxx11::string::~string(local_a0);
    }
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [11])0x4e9719,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
               (char (*) [2])0x4dff7a);
  }
  else {
    ::std::__cxx11::string::string((string *)local_50,(string *)exp_type);
    CompilerGLSL::convert_row_major_matrix
              (&this->super_CompilerGLSL,exp_str,(SPIRType *)local_50,
               (uint32_t)stack0xffffffffffffffd8,SUB41(local_50._36_4_,0));
    ::std::__cxx11::string::~string((string *)local_50);
  }
  return this;
}

Assistant:

string CompilerMSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t physical_type_id,
                                             bool is_packed)
{
	if (!is_matrix(exp_type))
	{
		return CompilerGLSL::convert_row_major_matrix(move(exp_str), exp_type, physical_type_id, is_packed);
	}
	else
	{
		strip_enclosed_expression(exp_str);
		if (physical_type_id != 0 || is_packed)
			exp_str = unpack_expression_type(exp_str, exp_type, physical_type_id, is_packed, true);
		return join("transpose(", exp_str, ")");
	}
}